

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.cpp
# Opt level: O1

void __thiscall
Trie<char,26ul,(char)97>::add<std::__cxx11::string>
          (Trie<char,26ul,(char)97> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *word)

{
  size_type sVar1;
  char cVar2;
  void *__s;
  long lVar3;
  char *pcVar4;
  
  pcVar4 = (word->_M_dataplus)._M_p;
  cVar2 = *pcVar4;
  if (cVar2 != '\0') {
    sVar1 = word->_M_string_length;
    do {
      if (pcVar4 == (word->_M_dataplus)._M_p + sVar1) break;
      lVar3 = (long)cVar2;
      if (*(long *)(this + lVar3 * 8 + -0x308) == 0) {
        __s = operator_new(0xd8);
        memset(__s,0,0xd8);
        *(void **)(this + lVar3 * 8 + -0x308) = __s;
      }
      this = *(Trie<char,26ul,(char)97> **)(this + lVar3 * 8 + -0x308);
      cVar2 = pcVar4[1];
      pcVar4 = pcVar4 + 1;
    } while (cVar2 != '\0');
  }
  *(long *)(this + 0xd0) = *(long *)(this + 0xd0) + 1;
  return;
}

Assistant:

void add(const Iteratable& word) {
    auto root = this;
    for (auto c = std::cbegin(word); *c and c != std::cend(word); ++c) {
      auto index = *c - offset;
      if (root->nodes[index] == nullptr) {
        root->nodes[index] = new Trie<Element, N, offset>();
      }
      root = root->nodes[index];
    }
    root->counter += 1;
  }